

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O3

bool boost::this_thread::interruption_requested(void)

{
  thread_data_base *ptVar1;
  undefined1 uVar2;
  
  ptVar1 = detail::get_current_thread_data();
  if (ptVar1 == (thread_data_base *)0x0) {
    uVar2 = 0;
  }
  else {
    mutex::lock(&ptVar1->data_mutex);
    uVar2 = ptVar1->interrupt_requested;
    mutex::unlock(&ptVar1->data_mutex);
  }
  return (bool)uVar2;
}

Assistant:

bool interruption_requested() BOOST_NOEXCEPT
        {
            boost::detail::thread_data_base* const thread_info=detail::get_current_thread_data();
            if(!thread_info)
            {
                return false;
            }
            else
            {
                lock_guard<mutex> lg(thread_info->data_mutex);
                return thread_info->interrupt_requested;
            }
        }